

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_cbor_object(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *this,size_t len,cbor_tag_handler_t tag_handler)

{
  bool bVar1;
  char_int_type cVar2;
  ulong in_RSI;
  size_t in_stack_00000008;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000010;
  size_t i;
  string_t key;
  string_t *in_stack_000000e0;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_000000e8;
  cbor_tag_handler_t in_stack_000003f0;
  undefined1 in_stack_000003f7;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_000003f8;
  string_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  byte in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  byte local_62;
  ulong local_48;
  string local_40 [40];
  ulong local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::start_object(in_stack_00000010,in_stack_00000008);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (local_18 != 0) {
      std::__cxx11::string::string(local_40);
      if (local_18 == 0xffffffffffffffff) {
        while (cVar2 = get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,
                                                CONCAT15(in_stack_ffffffffffffff95,
                                                         CONCAT14(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90))))),
              cVar2 != 0xff) {
          in_stack_ffffffffffffff97 = get_cbor_string(in_stack_000000e8,in_stack_000000e0);
          in_stack_ffffffffffffff96 = 1;
          if ((bool)in_stack_ffffffffffffff97) {
            in_stack_ffffffffffffff95 =
                 json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(1,CONCAT15(in_stack_ffffffffffffff95,
                                                       CONCAT14(in_stack_ffffffffffffff94,
                                                                in_stack_ffffffffffffff90)))),
                       in_stack_ffffffffffffff88);
            in_stack_ffffffffffffff96 = in_stack_ffffffffffffff95 ^ 0xff;
          }
          if ((in_stack_ffffffffffffff96 & 1) != 0) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_00e0a2b2;
          }
          in_stack_ffffffffffffff94 =
               parse_cbor_internal(in_stack_000003f8,(bool)in_stack_000003f7,in_stack_000003f0);
          if (((in_stack_ffffffffffffff94 ^ 0xff) & 1) != 0) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_00e0a2b2;
          }
          std::__cxx11::string::clear();
        }
      }
      else {
        for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
          get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT15(in_stack_ffffffffffffff95,
                                            CONCAT14(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90)))));
          bVar1 = get_cbor_string(in_stack_000000e8,in_stack_000000e0);
          local_62 = 1;
          if (bVar1) {
            bVar1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::key((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,
                                               CONCAT15(in_stack_ffffffffffffff95,
                                                        CONCAT14(in_stack_ffffffffffffff94,
                                                                 in_stack_ffffffffffffff90)))),
                          in_stack_ffffffffffffff88);
            local_62 = bVar1 ^ 0xff;
          }
          if ((local_62 & 1) != 0) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_00e0a2b2;
          }
          bVar1 = parse_cbor_internal(in_stack_000003f8,(bool)in_stack_000003f7,in_stack_000003f0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            bVar1 = true;
            goto LAB_00e0a2b2;
          }
          std::__cxx11::string::clear();
        }
      }
      bVar1 = false;
LAB_00e0a2b2:
      std::__cxx11::string::~string(local_40);
      if (bVar1) goto LAB_00e0a2de;
    }
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::end_object((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,
                                                CONCAT15(in_stack_ffffffffffffff95,
                                                         CONCAT14(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90)))));
  }
  else {
    local_1 = 0;
  }
LAB_00e0a2de:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_cbor_object(const std::size_t len,
                         const cbor_tag_handler_t tag_handler)
    {
        if (JSON_HEDLEY_UNLIKELY(!sax->start_object(len)))
        {
            return false;
        }

        if (len != 0)
        {
            string_t key;
            if (len != static_cast<std::size_t>(-1))
            {
                for (std::size_t i = 0; i < len; ++i)
                {
                    get();
                    if (JSON_HEDLEY_UNLIKELY(!get_cbor_string(key) || !sax->key(key)))
                    {
                        return false;
                    }

                    if (JSON_HEDLEY_UNLIKELY(!parse_cbor_internal(true, tag_handler)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
            else
            {
                while (get() != 0xFF)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_cbor_string(key) || !sax->key(key)))
                    {
                        return false;
                    }

                    if (JSON_HEDLEY_UNLIKELY(!parse_cbor_internal(true, tag_handler)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
        }

        return sax->end_object();
    }